

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_tests.cpp
# Opt level: O0

void __thiscall
wallet::wallet_tests::ListCoinsTestingSetup::ListCoinsTestingSetup(ListCoinsTestingSetup *this)

{
  long lVar1;
  type func;
  TestChain100Setup *in_RDI;
  long in_FS_OFFSET;
  ChainstateManager *in_stack_fffffffffffffe68;
  unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *in_stack_fffffffffffffe70;
  vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *in_stack_fffffffffffffe78;
  unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *this_00;
  char *in_stack_fffffffffffffe88;
  CKey *in_stack_fffffffffffffe90;
  TestChain100Setup *this_01;
  __native_type *chainstate;
  CPubKey *in_stack_fffffffffffffeb0;
  vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *in_stack_fffffffffffffeb8;
  TestChain100Setup *this_02;
  unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> local_130;
  TestOpts *in_stack_fffffffffffffed8;
  undefined8 in_stack_fffffffffffffee0;
  ChainType chain_type;
  TestChain100Setup *in_stack_fffffffffffffee8;
  __native_type local_108 [2];
  CKey *in_stack_ffffffffffffff50;
  CChain *in_stack_ffffffffffffff58;
  Chain *in_stack_ffffffffffffff60;
  
  chain_type = (ChainType)((ulong)in_stack_fffffffffffffee0 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_108[0].__align = 0;
  local_108[0]._8_8_ = 0;
  local_108[0]._16_8_ = 0;
  chainstate = local_108;
  this_02 = in_RDI;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_fffffffffffffe68);
  local_108[0].__size[0x18] = '\x01';
  local_108[0].__size[0x19] = '\x01';
  local_108[0].__size[0x1a] = '\x01';
  local_108[0].__size[0x1b] = '\x01';
  local_108[0].__size[0x1c] = '\0';
  TestChain100Setup::TestChain100Setup
            (in_stack_fffffffffffffee8,chain_type,in_stack_fffffffffffffed8);
  TestOpts::~TestOpts((TestOpts *)in_stack_fffffffffffffe68);
  this_01 = in_RDI + 1;
  std::unique_ptr<wallet::CWallet,std::default_delete<wallet::CWallet>>::
  unique_ptr<std::default_delete<wallet::CWallet>,void>
            ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
             in_stack_fffffffffffffe68);
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::vector
            ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)
             in_stack_fffffffffffffe68);
  CKey::GetPubKey(in_stack_fffffffffffffe90);
  GetScriptForRawPubKey(in_stack_fffffffffffffeb0);
  TestChain100Setup::CreateAndProcessBlock
            (this_02,in_stack_fffffffffffffeb8,(CScript *)in_stack_fffffffffffffeb0,
             (Chainstate *)&chainstate->__data);
  CBlock::~CBlock((CBlock *)in_stack_fffffffffffffe68);
  CScript::~CScript((CScript *)in_stack_fffffffffffffe68);
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::~vector
            (in_stack_fffffffffffffe78);
  func = std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>::operator*
                   ((unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *)
                    in_stack_fffffffffffffe78);
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             &chainstate->__data,(char *)in_RDI,(int)((ulong)this_01 >> 0x20),(char *)func,
             in_stack_fffffffffffffe88);
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_fffffffffffffe68);
  ChainstateManager::GetMutex(in_stack_fffffffffffffe68);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffe68);
  ListCoinsTestingSetup::anon_class_8_1_8991fb9c::operator()((anon_class_8_1_8991fb9c *)this_01);
  CreateSyncedWallet(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  this_00 = &local_130;
  std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator=
            (this_00,in_stack_fffffffffffffe70);
  std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::~unique_ptr(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

ListCoinsTestingSetup()
    {
        CreateAndProcessBlock({}, GetScriptForRawPubKey(coinbaseKey.GetPubKey()));
        wallet = CreateSyncedWallet(*m_node.chain, WITH_LOCK(Assert(m_node.chainman)->GetMutex(), return m_node.chainman->ActiveChain()), coinbaseKey);
    }